

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QString>::
emplace<QStringBuilder<QStringBuilder<QString_const&,char16_t>,QString>>
          (QMovableArrayOps<QString> *this,qsizetype i,
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *args)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QString tmp;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *in_stack_ffffffffffffff68;
  Inserter *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff8c;
  QArrayDataPointer<QString> *in_stack_ffffffffffffff90;
  Inserter local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QString>::needsDetach
                    ((QArrayDataPointer<QString> *)in_stack_ffffffffffffff70);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QString>::freeSpaceAtEnd
                          ((QArrayDataPointer<QString> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      QArrayDataPointer<QString>::end((QArrayDataPointer<QString> *)in_stack_ffffffffffffff70);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff68);
      in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_009083cf;
    }
    if ((in_RSI == (QString *)0x0) &&
       (qVar2 = QArrayDataPointer<QString>::freeSpaceAtBegin
                          ((QArrayDataPointer<QString> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x90825a);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff68);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_009083cf;
    }
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff68);
  bVar1 = in_RDI->displaceTo != (QString *)0x0;
  uVar3 = bVar1 && in_RSI == (QString *)0x0;
  QArrayDataPointer<QString>::detachAndGrow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(qsizetype)in_RDI,
             (QString **)CONCAT17(uVar3,in_stack_ffffffffffffff78),
             (QArrayDataPointer<QString> *)in_stack_ffffffffffffff70);
  if (bVar1 && in_RSI == (QString *)0x0) {
    QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x90832b);
    QString::QString((QString *)in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QString *)((long)&(in_RDI->displaceTo->d).d + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QString> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff78),
                       (qsizetype)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertOne(in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
    Inserter::~Inserter(&local_48);
  }
  QString::~QString((QString *)0x9083cf);
LAB_009083cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }